

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::internal::ConvertIdentifierNameToWords_abi_cxx11_(char *id_name)

{
  undefined1 uVar1;
  bool bVar2;
  char *in_RSI;
  string *in_RDI;
  bool starts_new_word;
  char *p;
  char prev_char;
  string *result;
  undefined6 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 in_stack_ffffffffffffffb1;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  bool bVar3;
  undefined1 uVar4;
  char *local_20;
  
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = in_RSI;
  do {
    if (*local_20 == '\0') {
      return in_RDI;
    }
    uVar1 = IsUpper('\0');
    bVar3 = true;
    if (!(bool)uVar1) {
      in_stack_ffffffffffffffb5 = IsAlpha('\0');
      if (!(bool)in_stack_ffffffffffffffb5) {
        in_stack_ffffffffffffffb4 = IsLower('\0');
        bVar3 = true;
        if ((bool)in_stack_ffffffffffffffb4) goto LAB_00140681;
      }
      in_stack_ffffffffffffffb3 = IsDigit('\0');
      in_stack_ffffffffffffffb2 = false;
      bVar3 = false;
      if (!(bool)in_stack_ffffffffffffffb3) {
        in_stack_ffffffffffffffb1 = IsDigit('\0');
        in_stack_ffffffffffffffb2 = in_stack_ffffffffffffffb1;
        bVar3 = (bool)in_stack_ffffffffffffffb1;
      }
    }
LAB_00140681:
    uVar4 = bVar3;
    bVar2 = IsAlNum('\0');
    if (bVar2) {
      if ((bVar3 != false) &&
         (in_stack_ffffffffffffffaf =
               std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(uVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffb5,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  CONCAT13(in_stack_ffffffffffffffb3,
                                                           CONCAT12(in_stack_ffffffffffffffb2,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffffb1,bVar2))))))),
                               (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                CONCAT16(in_stack_ffffffffffffffae,
                                                         in_stack_ffffffffffffffa8))),
         (bool)in_stack_ffffffffffffffaf)) {
        std::__cxx11::string::operator+=((string *)in_RDI,' ');
      }
      in_stack_ffffffffffffffae = ToLower('\0');
      std::__cxx11::string::operator+=((string *)in_RDI,in_stack_ffffffffffffffae);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

GTEST_API_ string ConvertIdentifierNameToWords(const char* id_name) {
  string result;
  char prev_char = '\0';
  for (const char* p = id_name; *p != '\0'; prev_char = *(p++)) {
    // We don't care about the current locale as the input is
    // guaranteed to be a valid C++ identifier name.
    const bool starts_new_word = IsUpper(*p) ||
        (!IsAlpha(prev_char) && IsLower(*p)) ||
        (!IsDigit(prev_char) && IsDigit(*p));

    if (IsAlNum(*p)) {
      if (starts_new_word && result != "")
        result += ' ';
      result += ToLower(*p);
    }
  }
  return result;
}